

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdGetTxOut(void *handle,int net_type,char *tx_hex_string,uint32_t index,int64_t *value_satoshi,
               char **locking_script)

{
  bool bVar1;
  int64_t iVar2;
  char *pcVar3;
  CfdException *this;
  bool is_bitcoin;
  Amount local_280;
  Script local_270;
  Script temp_locking_script;
  TransactionContext tx;
  TxOutReference ref;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    is_bitcoin = false;
    cfd::capi::ConvertNetType(net_type,&is_bitcoin);
    cfd::core::Amount::Amount(&local_280);
    cfd::core::Script::Script(&temp_locking_script);
    if (is_bitcoin == true) {
      std::__cxx11::string::string((string *)&ref,tx_hex_string,(allocator *)&local_270);
      cfd::TransactionContext::TransactionContext(&tx,(string *)&ref);
      std::__cxx11::string::~string((string *)&ref);
      cfd::core::Transaction::GetTxOut(&ref,&tx.super_Transaction,index);
      local_280.amount_ = ref.super_AbstractTxOutReference.value_.amount_;
      local_280.ignore_check_ = ref.super_AbstractTxOutReference.value_.ignore_check_;
      cfd::core::Script::Script(&local_270,&ref.super_AbstractTxOutReference.locking_script_);
      cfd::core::Script::operator=(&temp_locking_script,&local_270);
      cfd::core::Script::~Script(&local_270);
      cfd::core::AbstractTxOutReference::~AbstractTxOutReference(&ref.super_AbstractTxOutReference);
      cfd::TransactionContext::~TransactionContext(&tx);
    }
    else {
      std::__cxx11::string::string((string *)&tx,tx_hex_string,(allocator *)&local_270);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&ref,(string *)&tx);
      std::__cxx11::string::~string((string *)&tx);
      cfd::core::ConfidentialTransaction::GetTxOut
                ((ConfidentialTxOutReference *)&tx,(ConfidentialTransaction *)&ref,index);
      local_280.amount_ =
           CONCAT44(tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._4_4_,
                    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_);
      local_280.ignore_check_ =
           (bool)tx.super_Transaction.vin_.
                 super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                 super__Vector_impl_data._M_start._0_1_;
      cfd::core::Script::Script
                (&local_270,
                 (Script *)
                 &tx.super_Transaction.vin_.
                  super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      cfd::core::Script::operator=(&temp_locking_script,&local_270);
      cfd::core::Script::~Script(&local_270);
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                ((ConfidentialTxOutReference *)&tx);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&ref);
    }
    if (value_satoshi != (int64_t *)0x0) {
      iVar2 = cfd::core::Amount::GetSatoshiValue(&local_280);
      *value_satoshi = iVar2;
    }
    if (locking_script != (char **)0x0) {
      cfd::core::Script::GetHex_abi_cxx11_((string *)&tx,&temp_locking_script);
      pcVar3 = cfd::capi::CreateString((string *)&tx);
      *locking_script = pcVar3;
      std::__cxx11::string::~string((string *)&tx);
    }
    cfd::core::Script::~Script(&temp_locking_script);
    return 0;
  }
  tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x5277c7;
  tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0xa41;
  tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_83e3b2;
  cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&tx,"Failed to parameter. tx is null or empty.",(allocator *)&ref);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&tx);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxOut(
    void* handle, int net_type, const char* tx_hex_string, uint32_t index,
    int64_t* value_satoshi, char** locking_script) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    Amount temp_value;
    Script temp_locking_script;
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      const TxOutReference ref = tx.GetTxOut(index);
      temp_value = ref.GetValue();
      temp_locking_script = ref.GetLockingScript();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      const ConfidentialTxOutReference ref = tx.GetTxOut(index);
      temp_value = ref.GetValue();
      temp_locking_script = ref.GetLockingScript();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (value_satoshi != nullptr) {
      *value_satoshi = temp_value.GetSatoshiValue();
    }
    if (locking_script != nullptr) {
      *locking_script = CreateString(temp_locking_script.GetHex());
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}